

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_request.cc
# Opt level: O0

int __thiscall crail::CreateRequest::Write(CreateRequest *this,ByteBuffer *buffer)

{
  int iVar1;
  NamenodeRequest *in_RSI;
  ByteBuffer *in_RDI;
  Filename *unaff_retaddr;
  ByteBuffer *buf;
  
  buf = in_RDI;
  NamenodeRequest::Write(in_RSI,in_RDI);
  Filename::Write(unaff_retaddr,buf);
  iVar1 = (int)((ulong)buf >> 0x20);
  ByteBuffer::PutInt((ByteBuffer *)unaff_retaddr,iVar1);
  ByteBuffer::PutInt((ByteBuffer *)unaff_retaddr,iVar1);
  ByteBuffer::PutInt((ByteBuffer *)unaff_retaddr,iVar1);
  ByteBuffer::PutInt((ByteBuffer *)unaff_retaddr,iVar1);
  iVar1 = (*in_RDI->_vptr_ByteBuffer[3])();
  return iVar1;
}

Assistant:

int CreateRequest::Write(ByteBuffer &buffer) {
  NamenodeRequest::Write(buffer);
  filename_.Write(buffer);
  buffer.PutInt(type_);
  buffer.PutInt(storage_class_);
  buffer.PutInt(location_class_);
  buffer.PutInt(enumerable_);

  return Size();
}